

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

int ConvexDecomposition::calchullpbev
              (float3 *verts,int verts_count,int vlimit,Array<ConvexDecomposition::Plane> *planes,
              float bevangle)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  cbtHullTriangle *this;
  undefined1 auVar4 [16];
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  float *pfVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar18 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 extraout_var [60];
  undefined1 auVar17 [64];
  undefined1 auVar19 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar23 [60];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  float fVar24;
  float fVar25;
  Plane t;
  Plane t_00;
  float3 fVar26;
  float3 local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  
  planes->count = 0;
  iVar5 = calchullgen(verts,verts_count,vlimit);
  if (iVar5 == 0) {
    iVar5 = 0;
  }
  else {
    if (0 < DAT_00b98040) {
      auVar14 = ZEXT464((uint)(bevangle * 0.017453292));
      lVar9 = 0;
      do {
        auVar23 = in_ZMM1._4_60_;
        auVar18 = auVar14._8_56_;
        piVar2 = *(int **)(tris + lVar9 * 8);
        if (piVar2 != (int *)0x0) {
          fVar26 = TriNormal(verts + *piVar2,verts + piVar2[1],verts + piVar2[2]);
          auVar20._0_4_ = fVar26.z;
          auVar20._4_60_ = auVar23;
          auVar15._0_8_ = fVar26._0_8_;
          auVar15._8_56_ = auVar18;
          iVar5 = *piVar2;
          _local_68 = auVar15._0_16_;
          local_88 = vmovshdup_avx(_local_68);
          auVar12 = vfmadd231ss_fma(ZEXT416((uint)(local_88._0_4_ * verts[iVar5].y)),_local_68,
                                    ZEXT416((uint)verts[iVar5].x));
          local_78 = auVar20._0_16_;
          auVar12 = vfmadd231ss_fma(auVar12,local_78,ZEXT416((uint)verts[iVar5].z));
          auVar13._8_4_ = 0x80000000;
          auVar13._0_8_ = 0x8000000080000000;
          auVar13._12_4_ = 0x80000000;
          auVar12 = vxorps_avx512vl(auVar12,auVar13);
          auVar12 = vinsertps_avx(local_78,auVar12,0x10);
          t._8_8_ = auVar12._0_8_;
          t.normal.x = (float)(int)auVar15._0_8_;
          t.normal.y = (float)(int)((ulong)auVar15._0_8_ >> 0x20);
          in_ZMM1 = ZEXT1664(auVar12);
          auVar14._8_56_ = auVar18;
          auVar14._0_8_ = auVar15._0_8_;
          Array<ConvexDecomposition::Plane>::Add(planes,t);
          lVar11 = 0;
          do {
            auVar23 = in_ZMM1._4_60_;
            auVar18 = auVar14._8_56_;
            uVar1 = piVar2[lVar11 + 3];
            if (piVar2[6] <= (int)uVar1) {
              if (((int)uVar1 < 0) || (DAT_00b98040 <= (int)uVar1)) {
                __assert_fail("i>=0 && i<count",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                              ,0x577,
                              "Type &ConvexDecomposition::Array<ConvexDecomposition::cbtHullTriangle *>::operator[](int) [Type = ConvexDecomposition::cbtHullTriangle *]"
                             );
              }
              piVar3 = *(int **)(tris + (ulong)uVar1 * 8);
              fVar26 = TriNormal(verts + *piVar3,verts + piVar3[1],verts + piVar3[2]);
              auVar21._0_4_ = fVar26.z;
              auVar21._4_60_ = auVar23;
              auVar16._0_8_ = fVar26._0_8_;
              auVar16._8_56_ = auVar18;
              _local_48 = auVar16._0_16_;
              local_58 = vmovshdup_avx(_local_48);
              auVar12 = vfmadd231ss_fma(ZEXT416((uint)(local_58._0_4_ * (float)local_88._0_4_)),
                                        _local_48,ZEXT416((uint)local_68._0_4_));
              auVar12 = vfmadd231ss_fma(auVar12,auVar21._0_16_,ZEXT416((uint)local_78._0_4_));
              auVar14._0_4_ = cosf(bevangle * 0.017453292);
              auVar14._4_60_ = extraout_var;
              in_ZMM1 = ZEXT464((uint)auVar12._0_4_);
              if (auVar12._0_4_ < auVar14._0_4_) {
                auVar12._0_4_ = (float)local_48._0_4_ + (float)local_68._0_4_;
                auVar12._4_4_ = (float)local_48._4_4_ + (float)local_68._4_4_;
                auVar12._8_4_ = fStack_40 + fStack_60;
                auVar12._12_4_ = fStack_3c + fStack_5c;
                auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)((float)local_58._0_4_ +
                                                              (float)local_88._0_4_)),0x10);
                auVar18 = ZEXT856(auVar12._8_8_);
                local_98.z = auVar21._0_4_ + (float)local_78._0_4_;
                auVar23 = (undefined1  [60])0x0;
                local_98._0_8_ = vmovlps_avx(auVar12);
                fVar26 = normalize(&local_98);
                auVar22._0_4_ = fVar26.z;
                auVar22._4_60_ = auVar23;
                auVar17._0_8_ = fVar26._0_8_;
                auVar17._8_56_ = auVar18;
                if (verts_count == 0) {
                  __assert_fail("count",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                                ,0x881,
                                "int ConvexDecomposition::maxdir(const T *, int, const T &) [T = ConvexDecomposition::float3]"
                               );
                }
                auVar13 = auVar17._0_16_;
                auVar12 = vmovshdup_avx(auVar13);
                auVar19 = auVar22._0_16_;
                fVar24 = auVar12._0_4_;
                if (verts_count < 2) {
                  lVar7 = 0;
                }
                else {
                  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * verts->y)),auVar13,
                                            ZEXT416((uint)verts->x));
                  auVar12 = vfmadd231ss_fma(auVar12,auVar19,ZEXT416((uint)verts->z));
                  uVar6 = 0;
                  uVar8 = 1;
                  pfVar10 = &verts[1].z;
                  do {
                    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * pfVar10[-1])),auVar13,
                                             ZEXT416((uint)((float3 *)(pfVar10 + -2))->x));
                    auVar4 = vfmadd231ss_fma(auVar4,auVar19,ZEXT416((uint)*pfVar10));
                    fVar25 = auVar12._0_4_;
                    auVar12 = vmaxss_avx(auVar4,auVar12);
                    if (fVar25 < auVar4._0_4_) {
                      uVar6 = uVar8 & 0xffffffff;
                    }
                    uVar8 = uVar8 + 1;
                    pfVar10 = pfVar10 + 3;
                  } while ((uint)verts_count != uVar8);
                  lVar7 = (long)(int)uVar6;
                }
                auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * verts[lVar7].y)),auVar13,
                                          ZEXT416((uint)verts[lVar7].x));
                auVar12 = vfmadd231ss_fma(auVar12,auVar19,ZEXT416((uint)verts[lVar7].z));
                auVar4._8_4_ = 0x80000000;
                auVar4._0_8_ = 0x8000000080000000;
                auVar4._12_4_ = 0x80000000;
                auVar12 = vxorps_avx512vl(auVar12,auVar4);
                auVar12 = vinsertps_avx(auVar19,auVar12,0x10);
                t_00._8_8_ = auVar12._0_8_;
                t_00.normal.x = (float)(int)auVar17._0_8_;
                t_00.normal.y = (float)(int)((ulong)auVar17._0_8_ >> 0x20);
                in_ZMM1 = ZEXT1664(auVar12);
                auVar14._8_56_ = auVar18;
                auVar14._0_8_ = auVar17._0_8_;
                Array<ConvexDecomposition::Plane>::Add(planes,t_00);
              }
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != 3);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < DAT_00b98040);
    }
    if (0 < DAT_00b98040) {
      lVar9 = 0;
      do {
        this = *(cbtHullTriangle **)(tris + lVar9 * 8);
        if (this != (cbtHullTriangle *)0x0) {
          cbtHullTriangle::~cbtHullTriangle(this);
          operator_delete(this,0x24);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < DAT_00b98040);
    }
    DAT_00b98040 = 0;
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int calchullpbev(float3 *verts,int verts_count,int vlimit, Array<Plane> &planes,float bevangle) 
{
	int i,j;
	planes.count=0;
	int rc = calchullgen(verts,verts_count,vlimit);
	if(!rc) return 0;
	for(i=0;i<tris.count;i++)if(tris[i])
	{
		Plane p;
		cbtHullTriangle *t = tris[i];
		p.normal = TriNormal(verts[(*t)[0]],verts[(*t)[1]],verts[(*t)[2]]);
		p.dist   = -dot(p.normal, verts[(*t)[0]]);
		planes.Add(p);
		for(j=0;j<3;j++)
		{
			if(t->n[j]<t->id) continue;
			cbtHullTriangle *s = tris[t->n[j]];
			REAL3 snormal = TriNormal(verts[(*s)[0]],verts[(*s)[1]],verts[(*s)[2]]);
			if(dot(snormal,p.normal)>=cos(bevangle*DEG2RAD)) continue;
			REAL3 n = normalize(snormal+p.normal);
			planes.Add(Plane(n,-dot(n,verts[maxdir(verts,verts_count,n)])));
		}
	}

	for(i=0;i<tris.count;i++)if(tris[i])
	{
		delete tris[i]; // delete tris[i];
	}
	tris.count=0;
	return 1;
}